

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int defragmentPage(MemPage *pPage,int nMaxFrag)

{
  u8 *puVar1;
  ushort uVar2;
  ushort uVar3;
  u16 uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort *puVar7;
  ushort uVar8;
  uint uVar9;
  undefined8 uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  u8 *puVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint local_84;
  u8 *local_68;
  
  puVar1 = pPage->aData;
  uVar12 = (ulong)pPage->hdrOffset;
  uVar8 = pPage->cellOffset;
  uVar5 = pPage->nCell;
  uVar9 = (uint)uVar8 + (uint)uVar5 * 2;
  uVar11 = pPage->pBt->usableSize;
  if (nMaxFrag < (int)(uint)puVar1[uVar12 + 7]) {
LAB_0014997d:
    local_84 = uVar11 - 4;
    uVar19 = uVar11;
    if ((ulong)uVar5 != 0) {
      uVar2 = *(ushort *)(puVar1 + uVar12 + 5) << 8 | *(ushort *)(puVar1 + uVar12 + 5) >> 8;
      uVar13 = 0;
      local_68 = (u8 *)0x0;
      puVar15 = puVar1;
      do {
        uVar3 = *(ushort *)(puVar1 + uVar13 * 2 + (ulong)uVar8) << 8 |
                *(ushort *)(puVar1 + uVar13 * 2 + (ulong)uVar8) >> 8;
        if (((uint)uVar3 < (uint)uVar2) ||
           (uVar17 = (uint)uVar3, uVar17 != local_84 && (int)local_84 <= (int)(uint)uVar3)) {
          uVar10 = 0x10b51;
          goto LAB_00149c00;
        }
        uVar4 = (*pPage->xCellSize)(pPage,puVar15 + uVar17);
        uVar19 = uVar19 - uVar4;
        if (((int)uVar19 < (int)(uint)uVar2) || ((int)uVar11 < (int)((uint)uVar3 + (uint)uVar4))) {
          uVar10 = 0x10b57;
          goto LAB_00149c00;
        }
        *(ushort *)(puVar1 + uVar13 * 2 + (ulong)uVar8) = (ushort)uVar19 << 8 | (ushort)uVar19 >> 8;
        if (local_68 == (u8 *)0x0) {
          if (uVar19 != uVar17) {
            puVar15 = (u8 *)pPage->pBt->pPager->pTmpSpace;
            memcpy(puVar15 + uVar2,puVar1 + uVar2,(long)(int)(uVar11 - uVar2));
            local_68 = puVar15;
            goto LAB_00149a8a;
          }
          local_68 = (u8 *)0x0;
        }
        else {
LAB_00149a8a:
          memcpy(puVar1 + uVar19,puVar15 + uVar17,(ulong)uVar4);
        }
        uVar13 = uVar13 + 1;
      } while (uVar5 != uVar13);
    }
    puVar1[uVar12 + 7] = '\0';
  }
  else {
    uVar2 = *(ushort *)(puVar1 + uVar12 + 1) << 8 | *(ushort *)(puVar1 + uVar12 + 1) >> 8;
    if ((int)(uVar11 - 4) < (int)(uint)uVar2) {
      uVar10 = 0x10b20;
      goto LAB_00149c00;
    }
    uVar17 = (uint)uVar2;
    if (uVar2 == 0) goto LAB_0014997d;
    uVar3 = *(ushort *)(puVar1 + uVar2) << 8 | *(ushort *)(puVar1 + uVar2) >> 8;
    if (uVar11 - 4 < (uint)uVar3) {
      uVar10 = 0x10b23;
      goto LAB_00149c00;
    }
    if ((uVar3 != 0) && ((puVar1[uVar3] != '\0' || (puVar1[(ulong)uVar3 + 1] != '\0'))))
    goto LAB_0014997d;
    uVar5 = *(ushort *)(puVar1 + uVar12 + 5) << 8 | *(ushort *)(puVar1 + uVar12 + 5) >> 8;
    iVar14 = uVar17 - uVar5;
    if (uVar17 < uVar5 || iVar14 == 0) {
      uVar10 = 0x10b2b;
      goto LAB_00149c00;
    }
    uVar6 = *(ushort *)(puVar1 + (ulong)uVar2 + 2) << 8 |
            *(ushort *)(puVar1 + (ulong)uVar2 + 2) >> 8;
    uVar18 = (uint)uVar6;
    uVar19 = (uint)uVar6 + (uint)uVar2;
    if (uVar3 == 0) {
      uVar16 = 0;
      if ((int)uVar11 < (int)uVar19) {
        uVar10 = 0x10b34;
        goto LAB_00149c00;
      }
    }
    else {
      if (uVar3 < uVar19) {
        uVar10 = 0x10b2e;
        goto LAB_00149c00;
      }
      uVar2 = *(ushort *)(puVar1 + (ulong)uVar3 + 2) << 8 |
              *(ushort *)(puVar1 + (ulong)uVar3 + 2) >> 8;
      uVar16 = (uint)uVar2;
      if ((int)uVar11 < (int)((uint)uVar2 + (uint)uVar3)) {
        uVar10 = 0x10b30;
        goto LAB_00149c00;
      }
      memmove(puVar1 + (uVar2 + uVar19),puVar1 + uVar19,(long)(int)(uVar3 - uVar19));
      uVar18 = (uint)uVar6 + (uint)uVar2;
    }
    uVar19 = uVar18 + uVar5;
    memmove(puVar1 + uVar19,puVar1 + (uint)uVar5,(long)iVar14);
    if (uVar8 < uVar9) {
      puVar7 = (ushort *)(puVar1 + uVar8);
      do {
        uVar8 = *puVar7 << 8 | *puVar7 >> 8;
        uVar11 = uVar18;
        if ((uVar8 < uVar17) || (uVar11 = uVar16, (uint)uVar8 < (uint)uVar3)) {
          uVar8 = uVar8 + (short)uVar11;
          *puVar7 = uVar8 * 0x100 | uVar8 >> 8;
        }
        puVar7 = puVar7 + 1;
      } while (puVar7 < puVar1 + uVar9);
    }
  }
  if ((uint)puVar1[uVar12 + 7] + (uVar19 - uVar9) == pPage->nFree) {
    *(ushort *)(puVar1 + uVar12 + 5) = (ushort)uVar19 << 8 | (ushort)uVar19 >> 8;
    (puVar1 + uVar12 + 1)[0] = '\0';
    (puVar1 + uVar12 + 1)[1] = '\0';
    memset(puVar1 + uVar9,0,(long)(int)(uVar19 - uVar9));
    return 0;
  }
  uVar10 = 0x10b6a;
LAB_00149c00:
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar10,
              "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
  return 0xb;
}

Assistant:

static int defragmentPage(MemPage *pPage, int nMaxFrag){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */
  int iCellStart;            /* First cell offset in input */

  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  temp = 0;
  src = data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) || CORRUPT_DB );
  iCellFirst = cellOffset + 2*nCell;
  usableSize = pPage->pBt->usableSize;

  /* This block handles pages with two or fewer free blocks and nMaxFrag
  ** or fewer fragmented bytes. In this case it is faster to move the
  ** two (or one) blocks of cells using memmove() and add the required
  ** offsets to each pointer in the cell-pointer array than it is to
  ** reconstruct the entire page.  */
  if( (int)data[hdr+7]<=nMaxFrag ){
    int iFree = get2byte(&data[hdr+1]);
    if( iFree>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iFree ){
      int iFree2 = get2byte(&data[iFree]);
      if( iFree2>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
      if( 0==iFree2 || (data[iFree2]==0 && data[iFree2+1]==0) ){
        u8 *pEnd = &data[cellOffset + nCell*2];
        u8 *pAddr;
        int sz2 = 0;
        int sz = get2byte(&data[iFree+2]);
        int top = get2byte(&data[hdr+5]);
        if( top>=iFree ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }
        if( iFree2 ){
          if( iFree+sz>iFree2 ) return SQLITE_CORRUPT_PAGE(pPage);
          sz2 = get2byte(&data[iFree2+2]);
          if( iFree2+sz2 > usableSize ) return SQLITE_CORRUPT_PAGE(pPage);
          memmove(&data[iFree+sz+sz2], &data[iFree+sz], iFree2-(iFree+sz));
          sz += sz2;
        }else if( NEVER(iFree+sz>usableSize) ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }

        cbrk = top+sz;
        assert( cbrk+(iFree-top) <= usableSize );
        memmove(&data[cbrk], &data[top], iFree-top);
        for(pAddr=&data[cellOffset]; pAddr<pEnd; pAddr+=2){
          pc = get2byte(pAddr);
          if( pc<iFree ){ put2byte(pAddr, pc+sz); }
          else if( pc<iFree2 ){ put2byte(pAddr, pc+sz2); }
        }
        goto defragment_out;
      }
    }
  }

  cbrk = usableSize;
  iCellLast = usableSize - 4;
  iCellStart = get2byte(&data[hdr+5]);
  for(i=0; i<nCell; i++){
    u8 *pAddr;     /* The i-th cell pointer */
    pAddr = &data[cellOffset + i*2];
    pc = get2byte(pAddr);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
    /* These conditions have already been verified in btreeInitPage()
    ** if PRAGMA cell_size_check=ON.
    */
    if( pc<iCellStart || pc>iCellLast ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( pc>=iCellStart && pc<=iCellLast );
    size = pPage->xCellSize(pPage, &src[pc]);
    cbrk -= size;
    if( cbrk<iCellStart || pc+size>usableSize ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( cbrk+size<=usableSize && cbrk>=iCellStart );
    testcase( cbrk+size==usableSize );
    testcase( pc+size==usableSize );
    put2byte(pAddr, cbrk);
    if( temp==0 ){
      if( cbrk==pc ) continue;
      temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
      memcpy(&temp[iCellStart], &data[iCellStart], usableSize - iCellStart);
      src = temp;
    }
    memcpy(&data[cbrk], &src[pc], size);
  }
  data[hdr+7] = 0;

 defragment_out:
  assert( pPage->nFree>=0 );
  if( data[hdr+7]+cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  return SQLITE_OK;
}